

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall
AbstractTransaction_IsCoinBase_Test::TestBody(AbstractTransaction_IsCoinBase_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertionResult gtest_ar_;
  string local_40;
  TestTransaction tx;
  
  TestTransaction::TestTransaction(&tx);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = cfd::core::AbstractTransaction::IsCoinBase(&tx.super_AbstractTransaction);
      gtest_ar_.success_ = !bVar1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"is_coinbase","true","false",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
                   ,0x14c,local_40._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        std::__cxx11::string::~string((string *)&local_40);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_58);
      }
      goto LAB_00228517;
    }
  }
  else {
    testing::Message::Message((Message *)&local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x14b,
               "Expected: (is_coinbase = tx.IsCoinBase()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
LAB_00228517:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::AbstractTransaction::~AbstractTransaction(&tx.super_AbstractTransaction);
  return;
}

Assistant:

TEST(AbstractTransaction, IsCoinBase) {
  TestTransaction tx;
  bool is_coinbase = false;
  EXPECT_NO_THROW((is_coinbase = tx.IsCoinBase()));
  EXPECT_FALSE(is_coinbase);
}